

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O0

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  _Bool local_182;
  _Bool local_181;
  char local_178 [8];
  char checkip [128];
  uint bits;
  char *slash;
  char *check;
  ulong uStack_d8;
  _Bool match;
  size_t tokenlen;
  char *token;
  char *pcStack_c0;
  uint address;
  char *endptr;
  char hostip [128];
  ulong uStack_30;
  nametype type;
  size_t namelen;
  char *p;
  char *no_proxy_local;
  char *name_local;
  
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    hostip[0x7c] = '\0';
    hostip[0x7d] = '\0';
    hostip[0x7e] = '\0';
    hostip[0x7f] = '\0';
    iVar1 = strcmp("*",no_proxy);
    if (iVar1 == 0) {
      return true;
    }
    namelen = (size_t)no_proxy;
    if (*name == '[') {
      pcStack_c0 = strchr(name,0x5d);
      if (pcStack_c0 == (char *)0x0) {
        return false;
      }
      uStack_30 = (long)pcStack_c0 - (long)(name + 1);
      if (0x7f < uStack_30) {
        return false;
      }
      memcpy(&endptr,name + 1,uStack_30);
      hostip[uStack_30 - 8] = '\0';
      no_proxy_local = (char *)&endptr;
      hostip[0x7c] = '\x02';
      hostip[0x7d] = '\0';
      hostip[0x7e] = '\0';
      hostip[0x7f] = '\0';
    }
    else {
      iVar1 = inet_pton(2,name,(void *)((long)&token + 4));
      if (iVar1 == 1) {
        hostip[0x7c] = '\x01';
        hostip[0x7d] = '\0';
        hostip[0x7e] = '\0';
        hostip[0x7f] = '\0';
      }
      uStack_30 = strlen(name);
      no_proxy_local = name;
    }
    while (*(char *)namelen != '\0') {
      uStack_d8 = 0;
      check._7_1_ = false;
      while( true ) {
        slash = (char *)namelen;
        bVar3 = false;
        if ((*(char *)namelen != '\0') && (bVar3 = true, *(char *)namelen != ' ')) {
          bVar3 = *(char *)namelen == '\t';
        }
        if (!bVar3) break;
        namelen = namelen + 1;
      }
      while( true ) {
        bVar3 = false;
        if (((*(char *)namelen != '\0') && (bVar3 = false, *(char *)namelen != ' ')) &&
           (bVar3 = false, *(char *)namelen != '\t')) {
          bVar3 = *(char *)namelen != ',';
        }
        if (!bVar3) break;
        namelen = namelen + 1;
        uStack_d8 = uStack_d8 + 1;
      }
      if (uStack_d8 != 0) {
        if (hostip._124_4_ == 0) {
          if (*slash == '.') {
            local_181 = false;
            if (uStack_d8 - 1 <= uStack_30) {
              iVar1 = Curl_strncasecompare
                                ((char *)((long)slash + 1),
                                 no_proxy_local + (uStack_30 - (uStack_d8 - 1)),uStack_30);
              local_181 = iVar1 != 0;
            }
            check._7_1_ = local_181;
          }
          else {
            local_182 = false;
            if (uStack_d8 == uStack_30) {
              iVar1 = Curl_strncasecompare(slash,no_proxy_local,uStack_30);
              local_182 = iVar1 != 0;
            }
            check._7_1_ = local_182;
          }
        }
        else if (hostip._124_4_ - 1 < 2) {
          pcVar2 = strchr(slash,0x2f);
          checkip[0x7c] = '\0';
          checkip[0x7d] = '\0';
          checkip[0x7e] = '\0';
          checkip[0x7f] = '\0';
          if ((pcVar2 != (char *)0x0) && (pcVar2 < (char *)((long)slash + uStack_d8))) {
            checkip._124_4_ = atoi(pcVar2 + 1);
            if (0x7f < uStack_d8) goto LAB_0090db7c;
            memcpy(local_178,slash,uStack_d8);
            pcVar2[(long)(local_178 + -(long)slash)] = '\0';
            slash = local_178;
          }
          if (hostip._124_4_ == 2) {
            check._7_1_ = Curl_cidr6_match(no_proxy_local,slash,checkip._124_4_);
          }
          else {
            check._7_1_ = Curl_cidr4_match(no_proxy_local,slash,checkip._124_4_);
          }
        }
LAB_0090db7c:
        if (check._7_1_ != false) {
          return true;
        }
      }
      for (; *(char *)namelen == ','; namelen = namelen + 1) {
      }
    }
  }
  return false;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    char hostip[128];
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      namelen = strlen(name);
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          if(*token == '.') {
            ++token;
            --tokenlen;
            /* tailmatch */
            match = (tokenlen <= namelen) &&
              strncasecompare(token, name + (namelen - tokenlen), namelen);
          }
          else
            match = (tokenlen == namelen) &&
              strncasecompare(token, name, namelen);
          break;
        case TYPE_IPV4:
          /* FALLTHROUGH */
        case TYPE_IPV6: {
          const char *check = token;
          char *slash = strchr(check, '/');
          unsigned int bits = 0;
          char checkip[128];
          /* if the slash is part of this token, use it */
          if(slash && (slash < &check[tokenlen])) {
            bits = atoi(slash + 1);
            /* copy the check name to a temp buffer */
            if(tokenlen >= sizeof(checkip))
              break;
            memcpy(checkip, check, tokenlen);
            checkip[ slash - check ] = 0;
            check = checkip;
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}